

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

color_quad<unsigned_char,_int> * __thiscall
crnlib::color_quad<unsigned_char,_int>::set(color_quad<unsigned_char,_int> *this,int y,int alpha)

{
  int iVar1;
  int iVar2;
  uchar uVar3;
  int alpha_local;
  int y_local;
  color_quad<unsigned_char,_int> *this_local;
  
  iVar1 = clamp<int>(y);
  iVar2 = clamp<int>(alpha);
  uVar3 = (uchar)iVar1;
  (this->field_0).field_0.r = uVar3;
  (this->field_0).field_0.g = uVar3;
  (this->field_0).field_0.b = uVar3;
  (this->field_0).field_0.a = (uchar)iVar2;
  return this;
}

Assistant:

inline color_quad& set(parameter_type y, parameter_type alpha = component_traits::cMax)
        {
            y = clamp(y);
            alpha = clamp(alpha);
            r = static_cast<component_type>(y);
            g = static_cast<component_type>(y);
            b = static_cast<component_type>(y);
            a = static_cast<component_type>(alpha);
            return *this;
        }